

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditionalestimator.cxx
# Opt level: O3

int __thiscall ConditionalEstimator::init(ConditionalEstimator *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  double **ppdVar2;
  uint uVar3;
  int iVar4;
  void *in_RAX;
  void *pvVar5;
  long lVar6;
  size_t __n;
  ulong uVar7;
  int iVar8;
  
  this->bRejection = false;
  (this->super_Estimator).nSamples = 0;
  uVar1 = (this->super_Estimator).nEstimate;
  if ((uVar1 & 4) != 0) {
    uVar3 = this->nPost + this->nPre;
    in_RAX = (void *)(ulong)uVar3;
    if (-1 < (int)uVar3) {
      in_RAX = memset(this->aOne,0,(ulong)uVar3 * 8 + 8);
    }
  }
  if ((uVar1 & 0x20) != 0) {
    uVar3 = this->nPost + this->nPre;
    in_RAX = (void *)(ulong)uVar3;
    if (-1 < (int)uVar3) {
      in_RAX = memset(this->aEvents,0,(ulong)uVar3 * 8 + 8);
    }
  }
  if ((uVar1 & 8) != 0) {
    uVar3 = this->nPost + this->nPre;
    in_RAX = (void *)(ulong)uVar3;
    if (-1 < (int)uVar3) {
      in_RAX = memset(this->aTwo,0,(ulong)uVar3 * 8 + 8);
    }
  }
  if ((uVar1 & 0x10) != 0) {
    uVar3 = this->nPost + this->nPre;
    in_RAX = (void *)(ulong)uVar3;
    if (-1 < (int)uVar3) {
      in_RAX = memset(this->aThree,0,(ulong)uVar3 * 8 + 8);
    }
  }
  iVar4 = (int)in_RAX;
  if (((uVar1 & 2) != 0) && (iVar8 = this->nPost + this->nPre, -1 < iVar8)) {
    uVar1 = this->nDist;
    ppdVar2 = this->aDist;
    uVar7 = 0;
    do {
      if (0 < (int)uVar1) {
        in_RAX = memset(ppdVar2[uVar7],0,(ulong)uVar1 << 3);
      }
      iVar4 = (int)in_RAX;
      uVar7 = uVar7 + 1;
    } while (iVar8 + 1 != uVar7);
  }
  (this->condSampleRing).ringIsInitialised = false;
  lVar6 = (long)(this->condSampleRing).ringSize;
  if (0 < lVar6) {
    pvVar5 = memset((this->condSampleRing).ringData,0,lVar6 << 3);
    iVar4 = (int)pvVar5;
  }
  (this->condSampleRing).ringCurrentIndex = 0;
  (this->condSampleRing).ringDelayedAdd = 0.0;
  (this->condSampleRing).ringCacheInvalid = true;
  (this->condEventRing).ringIsInitialised = false;
  __n = (size_t)(this->condEventRing).ringSize;
  if (0 < (long)__n) {
    pvVar5 = memset((this->condEventRing).ringData,0,__n);
    iVar4 = (int)pvVar5;
  }
  (this->condEventRing).ringCurrentIndex = 0;
  (this->condEventRing).ringDelayedAdd = false;
  (this->condEventRing).ringCacheInvalid = true;
  return iVar4;
}

Assistant:

void ConditionalEstimator::init()
{
	bRejection = false;
	nSamples = 0;
	if(nEstimate & EST_MEAN)
		for(int i=0; i<nPre+nPost+1; i++)
			aOne[i] = 0.0;
	if(nEstimate & EST_EVENTS)
		for(int i=0; i<nPre+nPost+1; i++)
			aEvents[i] = 0.0;
	if(nEstimate & EST_VAR)
		for(int i=0; i<nPre+nPost+1; i++)
			aTwo[i] = 0.0;
	if(nEstimate & EST_CUR)
		for(int i=0; i<nPre+nPost+1; i++)
			aThree[i] = 0.0;
	if(nEstimate & EST_DENS) {
		for( int i=0; i<nPre+nPost+1; i++ )
			for( int j=0; j<nDist; j++ )
				aDist[i][j] = 0.0;
	}
	condSampleRing.clear();
	condEventRing.clear();
}